

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtesting.c
# Opt level: O2

void RDL_calculate_transitive_closure(char **graph,uint n)

{
  uint uVar1;
  int iVar2;
  void *__ptr;
  RDL_stack *stack;
  undefined4 *puVar3;
  uint *__ptr_00;
  ulong uVar4;
  ulong uVar5;
  ulong __size;
  
  __size = (ulong)n;
  __ptr = malloc(__size);
  for (uVar5 = 0; uVar5 != __size; uVar5 = uVar5 + 1) {
    stack = RDL_stack_new();
    memset(__ptr,0,__size);
    puVar3 = (undefined4 *)malloc(4);
    *puVar3 = (int)uVar5;
    RDL_stack_push(stack,puVar3);
    while( true ) {
      iVar2 = RDL_stack_empty(stack);
      if (iVar2 != 0) break;
      __ptr_00 = (uint *)RDL_stack_top(stack);
      uVar1 = *__ptr_00;
      RDL_stack_pop(stack);
      free(__ptr_00);
      *(undefined1 *)((long)__ptr + (ulong)uVar1) = 1;
      for (uVar4 = 0; __size != uVar4; uVar4 = uVar4 + 1) {
        if (graph[uVar1][uVar4] != '\0') {
          graph[uVar5][uVar4] = '\x01';
          graph[uVar4][uVar5] = '\x01';
          if (*(char *)((long)__ptr + uVar4) == '\0') {
            puVar3 = (undefined4 *)malloc(4);
            *puVar3 = (int)uVar4;
            RDL_stack_push(stack,puVar3);
          }
        }
      }
    }
    RDL_stack_delete(stack);
  }
  free(__ptr);
  return;
}

Assistant:

void RDL_calculate_transitive_closure(char** graph, unsigned n)
{
  RDL_stack* dfs_stack;
  char* visited = (char*)malloc(n * sizeof(*visited));
  unsigned i, j, current;
  unsigned *val, *current_element, *new_element;

  for (i = 0; i < n; ++i) {
    dfs_stack = RDL_stack_new();
    memset(visited, 0, n * sizeof(*visited));

    val = malloc(sizeof(*val));
    *val = i;

    RDL_stack_push(dfs_stack, val);

    while (!RDL_stack_empty(dfs_stack)) {
      current_element = RDL_stack_top(dfs_stack);
      current = *current_element;
      RDL_stack_pop(dfs_stack);
      free(current_element);

      visited[current] = 1;
      for (j = 0; j < n; ++j) {
        if (graph[current][j]) {
          graph[i][j] = 1;
          graph[j][i] = 1;
          if (!visited[j]) {
            new_element = malloc(sizeof(*new_element));
            *new_element = j;
            RDL_stack_push(dfs_stack, new_element);
          }
        }
      }
    }

    RDL_stack_delete(dfs_stack);
  }

  free(visited);
}